

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::Int64Parameter::ByteSizeLong(Int64Parameter *this)

{
  long lVar1;
  ulong uVar2;
  size_t sVar3;
  size_t sVar4;
  
  if (this->defaultvalue_ == 0) {
    sVar4 = 0;
  }
  else {
    uVar2 = this->defaultvalue_ | 1;
    lVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar4 = (ulong)((int)lVar1 * 9 + 0x49U >> 6) + 1;
  }
  if (this->_oneof_case_[0] == 0xb) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::Int64Set>((this->AllowedValues_).set_);
  }
  else {
    if (this->_oneof_case_[0] != 10) goto LAB_00205875;
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::Int64Range>((this->AllowedValues_).range_);
  }
  sVar4 = sVar4 + sVar3 + 1;
LAB_00205875:
  this->_cached_size_ = (int)sVar4;
  return sVar4;
}

Assistant:

size_t Int64Parameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.Int64Parameter)
  size_t total_size = 0;

  // int64 defaultValue = 1;
  if (this->defaultvalue() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int64Size(
        this->defaultvalue());
  }

  switch (AllowedValues_case()) {
    // .CoreML.Specification.Int64Range range = 10;
    case kRange: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *AllowedValues_.range_);
      break;
    }
    // .CoreML.Specification.Int64Set set = 11;
    case kSet: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *AllowedValues_.set_);
      break;
    }
    case ALLOWEDVALUES_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}